

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRepresentationContext::~IfcRepresentationContext
          (IfcRepresentationContext *this,void **vtt)

{
  void **vtt_local;
  IfcRepresentationContext *this_local;
  
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
  _vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
                    _vptr_ObjectHelper +
            (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>)
                  ._vptr_ObjectHelper[-3]) = vtt[3];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->ContextType);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
          field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>,
             vtt + 1);
  return;
}

Assistant:

IfcRepresentationContext() : Object("IfcRepresentationContext") {}